

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void CreateFile(uint64_t Size)

{
  ulong local_428;
  uint64_t i;
  ofstream fill;
  undefined1 local_210 [8];
  ofstream truncate;
  uint64_t Size_local;
  
  std::ofstream::ofstream(local_210,(string *)&filename_abi_cxx11_,_S_out);
  std::ofstream::close();
  std::ofstream::ofstream(&i,(string *)&filename_abi_cxx11_,_S_out);
  for (local_428 = 0; local_428 < Size; local_428 = local_428 + 1) {
    std::operator<<((ostream *)&i,"A");
  }
  std::ostream::flush();
  std::ofstream::~ofstream(&i);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void CreateFile(uint64_t Size)
{
    std::ofstream truncate(filename);
    truncate.close();

    std::ofstream fill(filename);
    for(uint64_t i = 0; i<Size; i++)
        { fill << "A"; }
    fill.flush();
}